

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * createAggContext(sqlite3_context *p,int nByte)

{
  Mem *pMem;
  
  pMem = p->pMem;
  if (nByte < 1) {
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = (char *)0x0;
  }
  else {
    sqlite3VdbeMemClearAndResize(pMem,nByte);
    pMem->flags = 0x8000;
    pMem->u = (MemValue)p->pFunc;
    if (pMem->z != (char *)0x0) {
      memset(pMem->z,0,(ulong)(uint)nByte);
      return pMem->z;
    }
  }
  return (void *)0x0;
}

Assistant:

static SQLITE_NOINLINE void *createAggContext(sqlite3_context *p, int nByte){
  Mem *pMem = p->pMem;
  assert( (pMem->flags & MEM_Agg)==0 );
  if( nByte<=0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
  }else{
    sqlite3VdbeMemClearAndResize(pMem, nByte);
    pMem->flags = MEM_Agg;
    pMem->u.pDef = p->pFunc;
    if( pMem->z ){
      memset(pMem->z, 0, nByte);
    }
  }
  return (void*)pMem->z;
}